

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.cpp
# Opt level: O3

int shm::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  void *__s;
  ostream *poVar7;
  int *piVar8;
  char *pcVar9;
  ostream *poVar10;
  SHMException *pSVar11;
  void *in_RCX;
  char in_DL;
  ulong in_RSI;
  stringstream errstr;
  stringstream path;
  stat st;
  string local_408;
  float local_3e8;
  undefined1 local_3d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0 [23];
  undefined1 local_248 [128];
  ios_base local_1c8 [264];
  stat local_c0;
  
  if (in_RSI == 0) {
    pSVar11 = (SHMException *)__cxa_allocate_exception(0x28);
    local_3d0._0_8_ = local_3d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d0,"nbytes cannot be zero when allocating memory!","");
    SHMException::SHMException(pSVar11,(string *)local_3d0);
    *(undefined ***)pSVar11 = &PTR__SHMException_00108c98;
    __cxa_throw(pSVar11,&TemplateSHMException<0>::typeinfo,SHMException::~SHMException);
  }
  lVar3 = sysconf(0x55);
  sVar4 = sysconf(0x1e);
  if (lVar3 * sVar4 < in_RSI) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_3d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3d0 + 0x10),"You\'ve tried to allocate too many bytes (",0x29);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)(local_3d0 + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"),",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," the total possible is (",0x18);
    poVar10 = std::ostream::_M_insert<long>((long)poVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,")\n",2);
    pSVar11 = (SHMException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    SHMException::SHMException(pSVar11,(string *)local_248);
    *(undefined ***)pSVar11 = &PTR__SHMException_00108c98;
    __cxa_throw(pSVar11,&TemplateSHMException<0>::typeinfo,SHMException::~SHMException);
  }
  local_3e8 = ceilf((float)in_RSI / (float)(long)sVar4);
  std::__cxx11::stringstream::stringstream((stringstream *)local_248);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_248 + 0x10),"/dev/shm/",9);
  sVar5 = strlen((char *)ctx);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_248 + 0x10),(char *)ctx,sVar5);
  std::__cxx11::stringbuf::str();
  poVar10 = (ostream *)(local_3d0 + 0x10);
  iVar1 = stat((char *)local_3d0._0_8_,&local_c0);
  if ((ostream *)local_3d0._0_8_ != poVar10) {
    operator_delete((void *)local_3d0._0_8_,local_3c0[0]._M_allocated_capacity + 1);
  }
  if (iVar1 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_3d0);
    poVar10 = (ostream *)(local_3d0 + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"SHM Handle already exists \"",0x1b);
    sVar4 = strlen((char *)ctx);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)ctx,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"\" already exists, please use open\n",0x22);
    pSVar11 = (SHMException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    SHMException::SHMException(pSVar11,&local_408);
    *(undefined ***)pSVar11 = &PTR__SHMException_00108d58;
    __cxa_throw(pSVar11,&TemplateSHMException<1>::typeinfo,SHMException::~SHMException);
  }
  iVar1 = shm_open((char *)ctx,0xc2,0x180);
  if (iVar1 == -1) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_3d0);
    piVar8 = __errno_location();
    if (*piVar8 == 0x11) {
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"SHM Handle already exists \"",0x1b);
      sVar4 = strlen((char *)ctx);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)ctx,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"\" already exists, please use open\n",0x22);
      pSVar11 = (SHMException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      SHMException::SHMException(pSVar11,&local_408);
      *(undefined ***)pSVar11 = &PTR__SHMException_00108d58;
      __cxa_throw(pSVar11,&TemplateSHMException<1>::typeinfo,SHMException::~SHMException);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"Failed to open shm with file descriptor \"",0x29);
    sVar4 = strlen((char *)ctx);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)ctx,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\", error code returned: ",0x18);
    pcVar9 = strerror(*piVar8);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)*(undefined8 *)(local_3c0[0]._M_allocated_capacity - 0x18)
                     );
    }
    else {
      sVar4 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar9,sVar4);
    }
    pSVar11 = (SHMException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    SHMException::SHMException(pSVar11,&local_408);
    *(undefined ***)pSVar11 = &PTR__SHMException_00108c98;
    __cxa_throw(pSVar11,&TemplateSHMException<0>::typeinfo,SHMException::~SHMException);
  }
  uVar6 = (ulong)(local_3e8 + 1.0);
  sVar5 = ((long)((local_3e8 + 1.0) - 9.223372e+18) & (long)uVar6 >> 0x3f | uVar6) * sVar4;
  iVar2 = ftruncate(iVar1,sVar5);
  if (iVar2 == 0) {
    __s = mmap(in_RCX,sVar5,3,1,iVar1,0);
    if (__s != (void *)0xffffffffffffffff) {
      if (in_DL != '\0') {
        memset(__s,0,in_RSI);
      }
      mprotect((void *)((long)__s + (sVar5 - sVar4)),sVar4,0);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_248);
      std::ios_base::~ios_base(local_1c8);
      return (int)__s;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_3d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3d0 + 0x10),"Failed to mmap shm region with the following error: ",
               0x34);
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    poVar10 = std::operator<<((ostream *)(local_3d0 + 0x10),pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,",\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"unlinking.",10);
    shm_unlink((char *)ctx);
    pSVar11 = (SHMException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    SHMException::SHMException(pSVar11,&local_408);
    *(undefined ***)pSVar11 = &PTR__SHMException_00108c98;
    __cxa_throw(pSVar11,&TemplateSHMException<0>::typeinfo,SHMException::~SHMException);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_3d0);
  poVar10 = (ostream *)(local_3d0 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"Failed to truncate shm for file descriptor (",0x2c);
  poVar7 = (ostream *)std::ostream::operator<<(poVar10,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"with number of bytes (",0x16);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,").  Error code returned: ",0x19);
  piVar8 = __errno_location();
  pcVar9 = strerror(*piVar8);
  std::operator<<(poVar10,pcVar9);
  shm_unlink((char *)ctx);
  pSVar11 = (SHMException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  SHMException::SHMException(pSVar11,&local_408);
  *(undefined ***)pSVar11 = &PTR__SHMException_00108c98;
  __cxa_throw(pSVar11,&TemplateSHMException<0>::typeinfo,SHMException::~SHMException);
}

Assistant:

void*
shm::init( const shm_key_t     &key,
           const std::size_t   nbytes,
           const bool zero   /* zero mem */,
           void   *ptr )
{
    auto handle_open_failure = [&]( const shm_key_t &key ) -> void*
    {
#if USE_CPP_EXCEPTIONS==1      
        std::stringstream ss;
#endif
        if( errno == EEXIST )
        {
#if USE_CPP_EXCEPTIONS==1      
            ss << "SHM Handle already exists \"" << key << "\" already exists, please use open\n";
            throw shm_already_exists( ss.str() );
#else            
            return( (void*)-1 );
#endif            
        }
        else 
        {
#if USE_CPP_EXCEPTIONS==1      
            ss << "Failed to open shm with file descriptor \"" << 
               key << "\", error code returned: ";
            ss << std::strerror( errno );
            throw bad_shm_alloc( ss.str() ); 
#else
            return( nullptr );
#endif
        }
    };

    if( nbytes == 0 )
    {
#if USE_CPP_EXCEPTIONS==1      
       throw bad_shm_alloc( "nbytes cannot be zero when allocating memory!" );
#else
        return( nullptr );
#endif
    }
    
    /** 
     * NOTE: 
     * - actual allocation size should be alloc_bytes,
     * user has no idea so we'll re-calc this at the  end
     * when we unmap the data.
     * - This is the same out that is returned at the end
     * for ease of keeping track of code between the two
     * different versions. 
     */
    void *out( nullptr );
    

    /**
     * NOTE: this is largely for truncation purposes,
     * but this is also needed as a sanity check and 
     * some off the values are needed elsewhere so let's
     * do this before we go into POSIX/SystemV specific 
     * code. 
     */
    const auto num_phys_pages( sysconf( _SC_PHYS_PAGES ) );
    const auto page_size( sysconf( _SC_PAGE_SIZE ) );
    const auto total_possible_bytes( num_phys_pages * page_size );
    if( nbytes > total_possible_bytes )
    {
    
#if USE_CPP_EXCEPTIONS==1      
         std::stringstream errstr;
         errstr << "You've tried to allocate too many bytes (" << nbytes << "),"
             << " the total possible is (" << total_possible_bytes << ")\n";
         throw bad_shm_alloc( errstr.str() ); 
#else
         //errno should be set (hopefully)
         return( nullptr );
#endif
    }
    /** get allocations size including extra dummy page **/
    const auto alloc_bytes( 
       static_cast< std::size_t >( 
          std::ceil(  
             static_cast< float >( nbytes) / 
            static_cast< float >( page_size ) ) + 1 /** one extra page for guard **/ ) * page_size 
    );
    
#if _USE_POSIX_SHM_ == 1
    int fd( shm::failure  );
    //stupid hack to get around platforms that are
    //using LD_PRELOAD, e.g., dynamic binary tools
    struct stat st;
    std::stringstream path;
    path << "/dev/shm/" << key;
    if( stat( path.str().c_str(), &st ) == 0 )
    {
#if USE_CPP_EXCEPTIONS==1      
        std::stringstream ss;
#endif
#if USE_CPP_EXCEPTIONS==1      
            ss << "SHM Handle already exists \"" << key << "\" already exists, please use open\n";
            throw shm_already_exists( ss.str() );
#else            
            return( (void*)-1 );
#endif            
    }
    
    /* set read/write set create if not exists */
    const std::int32_t flags( O_RDWR | O_CREAT | O_EXCL );
    /* set read/write by user */
    const mode_t mode( S_IWUSR | S_IRUSR );
    fd  = shm_open( key, 
                    flags, 
                    mode );
    if( fd == failure )
    {
        //if using exceptions you won't return
        return( handle_open_failure( key ) );
    }
    
    if( ftruncate( fd, alloc_bytes ) != shm::success )
    {
#if USE_CPP_EXCEPTIONS==1      
       std::stringstream ss;
       ss << "Failed to truncate shm for file descriptor (" << fd << ") ";
       ss << "with number of bytes (" << nbytes << ").  Error code returned: ";
       ss << std::strerror( errno );
       shm_unlink( key );
       throw bad_shm_alloc( ss.str() );
#else
       shm_unlink( key );
       return( nullptr );
#endif
    }

    /** 
     * NOTE: might be useful to change page size to something larger than default
     * for some applications. We'll add that as a future option, however, for now
     * I'll leave the note here.
     * flags = MAP_HUGETLB | MAP_ANONYMOUS | MAP_HUGE_2MB
     * flags = MAP_HUGETLB | MAP_ANONYMOUS | MAP_HUGE_1GB
     * we'll need to make sure huge pages are installed/enabled first
     * for ubuntu + apt:
     * apt-get install hugepages
     * you'll need to set it up, some good info if you don't know what you're 
     * doing is here: https://kerneltalks.com/services/what-is-huge-pages-in-linux/
     * you'll likely need to reboot to clear out any funky kernel states, once you're done,
     * write a test program and make sure that you're allocating, the command:
     * hugeadm --explain 
     * should tell you what's set up and in use.
     */
    out = mmap( ptr, 
                alloc_bytes, 
                ( PROT_READ | PROT_WRITE ), 
                MAP_SHARED, 
                fd, 
                0 );
    if( out == MAP_FAILED )
    {
#if USE_CPP_EXCEPTIONS==1      
       std::stringstream ss;
       ss << "Failed to mmap shm region with the following error: " << 
         std::strerror( errno ) << ",\n" << "unlinking.";
       shm_unlink( key );
       throw bad_shm_alloc( ss.str() );
#else
       shm_unlink( key );
       return( nullptr );
#endif
    }
/**
 * ###### END POSIX SECTION ######
 */
#elif _USE_SYSTEMV_SHM_ == 1
/**
 * ###### START SYSTEM-V SECTION  ######
 */
    /** first time you try to open it **/
    const auto shmid = 
        shmget( key, alloc_bytes, IPC_CREAT | IPC_EXCL | S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP );
    if( shmid == shm::failure ) 
    {
        //if using exceptions, you won't return from this
        return( handle_open_failure( key ) );
    }

    out  = shmat( shmid, nullptr, 0 );
    if( out == (void*)-1 )
    {
#if USE_CPP_EXCEPTIONS==1      
       std::stringstream ss;
       ss << "Failed to mmap shm region with the following error: " << 
         std::strerror( errno ) << ",\n" << "unlinking.";
       throw bad_shm_alloc( ss.str() );
#else
       return( nullptr );
#endif
    }


#endif /** end switch between posix/sysV **/    
    if( zero )
    {
       /* everything theoretically went well, lets initialize to zero */
       std::memset( out, 0x0, nbytes );
    }
    char *temp( reinterpret_cast< char* >( out ) );
    /** we allocate one extra page **/
    if( mprotect( (void*) &temp[ alloc_bytes - page_size ],
                   page_size, 
                   PROT_NONE ) != 0 )
    {
#if DEBUG   
      perror( "Error, failed to set page protection, not fatal just dangerous." );
#endif      
   }
   return( out );
}